

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

int __thiscall
mpt::message_store::entry::set(entry *this,char *from,int type,char *fmt,__va_list_tag *arg)

{
  int iVar1;
  reference<mpt::array::content> in_RAX;
  undefined1 *puVar2;
  size_t sVar3;
  void *pvVar4;
  content *pcVar5;
  content *pcVar6;
  int iVar7;
  content cVar8;
  size_t len;
  array d;
  array local_38;
  
  local_38._buf._ref = (reference<mpt::array::content>)(reference<mpt::array::content>)in_RAX._ref;
  array::array(&local_38,0);
  puVar2 = (undefined1 *)array::append(&local_38,4,(void *)0x0);
  iVar7 = -1;
  if (puVar2 != (undefined1 *)0x0) {
    *(undefined2 *)(puVar2 + 1) = 0;
    *puVar2 = 0;
    puVar2[3] = (char)type;
    if (from == (char *)0x0) {
      cVar8 = (content)0x0;
    }
    else {
      sVar3 = strlen(from);
      if (sVar3 < 0xff) {
        len = sVar3 + 1;
        pvVar4 = array::append(&local_38,len,from);
      }
      else {
        pvVar4 = array::append(&local_38,0xff,from);
        if (pvVar4 == (void *)0x0) goto LAB_0012e613;
        pvVar4 = array::append(&local_38,1,"");
        len = 0xff;
      }
      cVar8 = SUB81(len,0);
      if (pvVar4 == (void *)0x0) goto LAB_0012e613;
    }
    pcVar6 = (content *)0x0;
    pcVar5 = (content *)((long)local_38._buf._ref + 0x20);
    if (*(long *)((long)local_38._buf._ref + 8) != 0) {
      pcVar5 = pcVar6;
    }
    *pcVar5 = cVar8;
    if (fmt != (char *)0x0) {
      iVar1 = mpt_vprintf(&local_38,fmt,arg);
      if (iVar1 < 0) goto LAB_0012e613;
      pcVar5 = (content *)0x0;
      if (*(long *)((long)local_38._buf._ref + 8) == 0) {
        pcVar5 = (content *)((long)local_38._buf._ref + 0x20);
      }
      pcVar6 = (content *)0x1;
    }
    pcVar5[1] = SUB81(pcVar6,0);
    mpt_array_clone(this,&local_38);
    pcVar5 = (this->super_array)._buf._ref;
    iVar7 = 0;
    if ((pcVar5 != (content *)0x0) && (iVar7 = 0, *(long *)(pcVar5 + 8) == 0)) {
      iVar7 = *(int *)(pcVar5 + 0x18);
    }
  }
LAB_0012e613:
  if (local_38._buf._ref != (content *)0x0) {
    (**(code **)(*(long *)local_38._buf._ref + 8))();
  }
  return iVar7;
}

Assistant:

int message_store::entry::set(const char *from, int type, const char *fmt, va_list arg)
{
	header *h;
	array d;
	size_t len;
	
	if (!(h = static_cast<header *>(d.append(sizeof(*h))))) {
		return -1;
	}
	h->args = 0;
	h->from = 0;
	h->type = type;
	h->_cmd = 0;
	
	static const size_t maxlen = std::numeric_limits<__decltype(h->from)>::max();
	if (!from) {
		len = 0;
	}
	else if ((len = strlen(from)) >= maxlen) {
		static const char end = 0;
		if (!(d.append(maxlen, from)) || !(d.append(1, &end))) {
			return -1;
		}
		len = maxlen;
	} else {
		if (!(d.append(++len, from))) {
			return -1;
		}
	}
	h = static_cast<header *>(d.base());
	h->from = len;
	
	if (!fmt) {
		h->args = 0;
	}
	else if (mpt_vprintf(&d, fmt, arg) < 0) {
		return -1;
	} else {
		h = static_cast<header *>(d.base());
		h->args = 1;
	}
	
	mpt_array_clone(this, &d);
	
	return length();
}